

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knowledge_dynamics.cc
# Opt level: O0

void __thiscall explode::knowledge_dynamics::unpack(knowledge_dynamics *this,output_exe_file *oexe)

{
  uint16_t uVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 extraout_var;
  decoder_error *pdVar10;
  uint16_t *puVar11;
  size_t remains;
  size_t j;
  size_t bytes_left;
  size_t bytes_extra;
  size_t bit_pos;
  size_t byte_pos;
  uint16_t keep_index;
  uint32_t big_index;
  uint16_t last_index;
  uint8_t last_char;
  ulong uStack_9550;
  uint16_t next_index;
  size_t queued;
  uint8_t queue [255];
  ushort local_943c;
  ushort local_943a;
  uint8_t auStack_9438 [4];
  uint16_t dict_range;
  uint16_t dict_index;
  uint8_t dict_val [12288];
  uint16_t dict_key [12288];
  size_t bx;
  size_t step;
  ulong uStack_420;
  bool reset_hack;
  size_t pos;
  char mbuffer [1024];
  output_exe_file *oexe_local;
  knowledge_dynamics *this_local;
  
  mbuffer._1016_8_ = oexe;
  (*this->m_file->_vptr_input[5])(this->m_file,(ulong)this->m_code_offs);
  (*this->m_file->_vptr_input[2])(this->m_file,&pos,0x400);
  uStack_420 = 0;
  bVar4 = false;
  bx = 9;
  dict_key[0x2ffc] = 0;
  dict_key[0x2ffd] = 0;
  dict_key[0x2ffe] = 0;
  dict_key[0x2fff] = 0;
  local_943a = 0x102;
  local_943c = 0x200;
  uStack_9550 = 0;
  big_index._1_1_ = '\0';
  keep_index = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        if (bVar4) {
          bx = 9;
          local_943c = 0x200;
          local_943a = 0x102;
        }
        bit_pos = uStack_420 >> 3;
        uVar7 = uStack_420 & 7;
        bytes_extra = uVar7;
        if (0x3fc < bit_pos) {
          lVar3 = -bit_pos;
          uVar8 = lVar3 + 0x400;
          uVar9 = 0x400 - uVar8;
          for (remains = 0; remains < uVar8; remains = remains + 1) {
            mbuffer[remains - 8] = mbuffer[uVar9 + remains + -8];
          }
          iVar6 = (*this->m_file->_vptr_input[4])();
          if (CONCAT44(extraout_var,iVar6) < uVar9) {
            (*this->m_file->_vptr_input[2])
                      (this->m_file,mbuffer + lVar3 + 0x3f8,CONCAT44(extraout_var,iVar6));
          }
          else {
            (*this->m_file->_vptr_input[2])(this->m_file,mbuffer + lVar3 + 0x3f8,uVar9);
          }
          bit_pos = 0;
          uStack_420 = uVar7;
          if (bVar4) {
            bytes_extra = uVar8;
          }
        }
        uStack_420 = bx + uStack_420;
        if (7 < bx - 9) {
          pdVar10 = (decoder_error *)__cxa_allocate_exception(0x10);
          decoder_error::decoder_error(pdVar10,"Overflow");
          __cxa_throw(pdVar10,&decoder_error::typeinfo,decoder_error::~decoder_error);
        }
        uVar5 = (ushort)(((uint)(byte)mbuffer[bit_pos - 6] << 0x10 |
                          (uint)(byte)mbuffer[bit_pos - 7] << 8 | (uint)(byte)mbuffer[bit_pos - 8])
                        >> ((byte)bytes_extra & 0x1f)) & unpack::keyMask[bx - 9];
        if (!bVar4) break;
        big_index._1_1_ = (uint8_t)uVar5;
        (**(code **)(*(long *)mbuffer._1016_8_ + 0x20))
                  (mbuffer._1016_8_,dict_key._24568_8_,big_index._1_1_,1);
        bVar4 = false;
        keep_index = uVar5;
        dict_key._24568_8_ = dict_key._24568_8_ + 1;
      }
      if (uVar5 == 0x101) {
        uVar1 = this->m_header[0xb];
        puVar11 = output_exe_file::operator[]((output_exe_file *)mbuffer._1016_8_,INITIAL_CS);
        *puVar11 = uVar1;
        uVar1 = this->m_header[10];
        puVar11 = output_exe_file::operator[]((output_exe_file *)mbuffer._1016_8_,INITIAL_IP);
        *puVar11 = uVar1;
        uVar1 = this->m_header[7];
        puVar11 = output_exe_file::operator[]((output_exe_file *)mbuffer._1016_8_,INITIAL_SS);
        *puVar11 = uVar1;
        uVar1 = this->m_header[8];
        puVar11 = output_exe_file::operator[]((output_exe_file *)mbuffer._1016_8_,INITIAL_SP);
        *puVar11 = uVar1;
        uVar1 = this->m_header[6];
        puVar11 = output_exe_file::operator[]((output_exe_file *)mbuffer._1016_8_,MAX_MEM_PARA);
        *puVar11 = uVar1;
        uVar2 = this->m_expected_size;
        puVar11 = output_exe_file::operator[]((output_exe_file *)mbuffer._1016_8_,MIN_MEM_PARA);
        *puVar11 = (uint16_t)(uVar2 + 0x20 >> 6);
        (**(code **)(*(long *)mbuffer._1016_8_ + 0x30))();
        return;
      }
      if (uVar5 != 0x100) break;
      bVar4 = true;
    }
    big_index._2_2_ = uVar5;
    if (local_943a <= uVar5) {
      big_index._2_2_ = keep_index;
      if (0xfe < uStack_9550) {
        pdVar10 = (decoder_error *)__cxa_allocate_exception(0x10);
        decoder_error::decoder_error(pdVar10,"Overflow");
        __cxa_throw(pdVar10,&decoder_error::typeinfo,decoder_error::~decoder_error);
      }
      queue[uStack_9550 - 8] = big_index._1_1_;
      uStack_9550 = uStack_9550 + 1;
    }
    for (; 0xff < big_index._2_2_; big_index._2_2_ = dict_key[(ulong)big_index._2_2_ - 4]) {
      if (0xfe < uStack_9550) {
        pdVar10 = (decoder_error *)__cxa_allocate_exception(0x10);
        decoder_error::decoder_error(pdVar10,"Overflow");
        __cxa_throw(pdVar10,&decoder_error::typeinfo,decoder_error::~decoder_error);
      }
      if (0x2fff < big_index._2_2_) {
        pdVar10 = (decoder_error *)__cxa_allocate_exception(0x10);
        decoder_error::decoder_error(pdVar10,"Overflow");
        __cxa_throw(pdVar10,&decoder_error::typeinfo,decoder_error::~decoder_error);
      }
      queue[uStack_9550 - 8] = auStack_9438[big_index._2_2_];
      uStack_9550 = uStack_9550 + 1;
    }
    big_index._1_1_ = (uint8_t)big_index._2_2_;
    if (0xfe < uStack_9550) {
      pdVar10 = (decoder_error *)__cxa_allocate_exception(0x10);
      decoder_error::decoder_error(pdVar10,"Overflow");
      __cxa_throw(pdVar10,&decoder_error::typeinfo,decoder_error::~decoder_error);
    }
    queue[uStack_9550 - 8] = big_index._1_1_;
    uStack_9550 = uStack_9550 + 1;
    while (uStack_9550 != 0) {
      (**(code **)(*(long *)mbuffer._1016_8_ + 0x20))
                (mbuffer._1016_8_,dict_key._24568_8_,
                 *(undefined1 *)((long)&next_index + uStack_9550 + 1),1);
      uStack_9550 = uStack_9550 - 1;
      dict_key._24568_8_ = dict_key._24568_8_ + 1;
    }
    if (0x2fff < big_index._2_2_) break;
    dict_key[(ulong)local_943a - 4] = keep_index;
    auStack_9438[local_943a] = big_index._1_1_;
    local_943a = local_943a + 1;
    keep_index = uVar5;
    if ((local_943c <= local_943a) && (bx < 0xc)) {
      bx = bx + 1;
      local_943c = local_943c << 1;
    }
  }
  pdVar10 = (decoder_error *)__cxa_allocate_exception(0x10);
  decoder_error::decoder_error(pdVar10,"Overflow");
  __cxa_throw(pdVar10,&decoder_error::typeinfo,decoder_error::~decoder_error);
}

Assistant:

void knowledge_dynamics::unpack(output_exe_file& oexe)
  {
    m_file.seek(m_code_offs);

    static const std::size_t MBUFFER_SIZE = 1024;
    static const std::size_t MBUFFER_EDGE = (MBUFFER_SIZE - 3);

    char mbuffer[MBUFFER_SIZE];
    m_file.read_buff(mbuffer, MBUFFER_SIZE);

    std::size_t pos = 0;
    bool reset_hack = false;
    std::size_t step = 9;
    std::size_t bx = 0;
    /*
     * The dictionary.
     * Each entry consists of an index to a previous entry
     * and a value, forming a tree.
     */
    uint16_t dict_key[768 * 16];
    uint8_t  dict_val[768 * 16];
    uint16_t dict_index = 0x0102; /* Start populating dictionary from 0x0102 */
    uint16_t dict_range = 0x0200; /* Allow that much entries before increasing step */

    /* Since data stored this way is backwards, we need a small queue */
    uint8_t queue[0xFF];
    std::size_t queued = 0;
    uint16_t next_index = 0;	/* block of data we currently examine */

    uint8_t last_char = 0;	/* value from previous iteration */
    uint16_t last_index = 0;	/* block from previous iteration */

    uint32_t big_index;	/* temp. variable to safely load and shift 3 bytes */
    uint16_t keep_index;	/* temp. variable to keep "next_index" before making it "last_index" */
    while (true)
      {
	if (reset_hack)
	  {
	    step = 9;
	    dict_range = 0x0200;
	    dict_index = 0x0102;
	  }
	std::size_t byte_pos = pos / 8;
	std::size_t bit_pos = pos % 8;

	pos += step;	/* And advance to the next chunk */

	if (byte_pos >= MBUFFER_EDGE)
	  {
	    std::size_t bytes_extra = MBUFFER_SIZE - byte_pos;//~= 3
	    std::size_t bytes_left = MBUFFER_SIZE - bytes_extra;//~= 1021

	    /* Copy leftovers */
	    for (std::size_t j = 0; j < bytes_extra; j++) mbuffer[j] = mbuffer[bytes_left + j];

	    /* Read in the rest */
	    std::size_t remains = static_cast <std::size_t> (m_file.bytes_remains());
	    if (remains < bytes_left)
	      {
		m_file.read_buff(mbuffer + bytes_extra, remains);
	      }
	    else
	      {
		m_file.read_buff(mbuffer + bytes_extra, bytes_left);
	      }
				

	    /* Reset cursor */
	    pos = bit_pos + step;	/* Add all unused bits */
	    byte_pos = 0;
	    /* On dictionary reset, use byte offset as bit offset*/
	    if (reset_hack)
	      {
		bit_pos = bytes_extra;
	      }
	  }
	
	big_index =
	  static_cast <uint32_t>((static_cast <uint8_t>(mbuffer[byte_pos + 2]) & 0x00FF) << 16) |
	  static_cast <uint32_t>((static_cast <uint8_t>(mbuffer[byte_pos + 1]) & 0x00FF) << 8) |
	  static_cast <uint32_t>(static_cast <uint8_t>(mbuffer[byte_pos]) & 0x00FF);

	big_index >>= bit_pos;

	next_index = static_cast <uint16_t> (big_index & 0xFFFF);

	static /* Those masks help us get the relevant bits */ 
	  const uint16_t keyMask[4] = {
	  0x01FF, 	// 0001 1111 
	  0x03FF,		// 0011 1111
	  0x07FF,		// 0111 1111
	  0x0FFF,		// 1111 1111
	};

	if (step - 9 >= sizeof (keyMask))
	  {
	    throw decoder_error ("Overflow");
	  }
	next_index &= keyMask[(step - 9)];
	/* Apply the value as-is, continuing with dictionary reset, C) */
	if (reset_hack)
	  {
	    /* Save index */
	    last_index = next_index;
	    /* Output char value */
	    last_char = static_cast <uint8_t>(next_index & 0x00FF);
	    oexe.code_fill(bx++, last_char, 1);
				
	    /* We're done with the hack */
	    reset_hack = false;
	    continue;
	  }
	if (next_index == 0x0101)	/* End Of File */
	  {
	    /* DONE */
	    break;
	  }

	if (next_index == 0x0100) 	/* Reset dictionary */
	  {
	    /* Postpone it into next iteration */
	    reset_hack = true;
	    continue;
	  }

	/* Remember *real* "next_index" */
	keep_index = next_index;

	/* No dictionary entry to query, step back */
	if (next_index >= dict_index)
	  {
	    next_index = last_index;
	    if (queued >= sizeof (queue))
	      {
		throw decoder_error ("Overflow");
	      }
	    /* Queue 1 char */
	    queue[queued++] = last_char;
	  }

	/* Quering dictionary? */
	while (next_index > 0x00ff)
	  {
			  
	    /* Queue 1 char */
	    if (queued >= sizeof (queue))
	      {
		throw decoder_error ("Overflow");
	      }
	    if (next_index >= sizeof (dict_val))
	      {
		throw decoder_error ("Overflow");
	      }
	    queue[queued++] = dict_val[next_index];
	    /* Next query: */
	    next_index = dict_key[next_index];
	  }

	/* Queue 1 char */
	last_char = static_cast <uint8_t> (next_index & 0x00FF);
	if (queued >= sizeof (queue))
	  {
	    throw decoder_error ("Overflow");
	  }
	queue[queued++] = last_char;

	/* Unqueue */
	while (queued)
	  {
	    oexe.code_fill(bx++, queue[--queued], 1);
	  }

	/* Save value to the dictionary */
	if (next_index >= sizeof (dict_val))
	  {
	    throw decoder_error ("Overflow");
	  }
	dict_key[dict_index] = last_index; /* "goto prev entry" */
	dict_val[dict_index] = last_char;  /* the value */
	dict_index++;

	/* Save *real* "next_index" */
	last_index = keep_index;

	/* Edge of dictionary, increase the bit-step, making range twice as large. */
	if (dict_index >= dict_range && step < 12)
	  {
	    step += 1;
	    dict_range = static_cast <uint16_t> (dict_range*2);
	  }
      }
    oexe[exe_file::INITIAL_CS] = m_header[exe_file::INITIAL_CS];
    oexe[exe_file::INITIAL_IP] = m_header[exe_file::INITIAL_IP];
    oexe[exe_file::INITIAL_SS] = m_header[exe_file::INITIAL_SS];
    oexe[exe_file::INITIAL_SP] = m_header[exe_file::INITIAL_SP];
    oexe[exe_file::MAX_MEM_PARA] = m_header[exe_file::MAX_MEM_PARA];
    oexe[exe_file::MIN_MEM_PARA] = static_cast <uint16_t> ((m_expected_size + 0x20) / 64);
    oexe.eval_structures();
  }